

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

void helper_msr_banked_arm(CPUARMState *env,uint32_t value,uint32_t tgtmode,uint32_t regno)

{
  int line;
  char *file;
  uint uVar1;
  
  msr_mrs_banked_exc_checks(env,tgtmode,regno);
  uVar1 = regno - 8;
  if (uVar1 < 5) {
    if (tgtmode == 0x11) {
      env->fiq_regs[uVar1] = value;
    }
    else if (tgtmode == 0x10) {
      env->usr_regs[uVar1] = value;
    }
    return;
  }
  switch(regno) {
  case 0xd:
    uVar1 = tgtmode - 0x10;
    if ((uVar1 < 0x10) && ((0x8ccfU >> (uVar1 & 0x1f) & 1) != 0)) {
      env->banked_r13[*(long *)(&DAT_00d74630 + (ulong)uVar1 * 8)] = value;
      return;
    }
    break;
  case 0xe:
    uVar1 = tgtmode - 0x10;
    if ((uVar1 < 0x10) && ((0x8ccfU >> (uVar1 & 0x1f) & 1) != 0)) {
      env->banked_r14[*(long *)(&DAT_00d746b0 + (ulong)uVar1 * 8)] = value;
      return;
    }
    break;
  default:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/op_helper.c"
    ;
    line = 0x23f;
    goto LAB_0059e591;
  case 0x10:
    uVar1 = tgtmode - 0x10;
    if ((uVar1 < 0x10) && ((0x8ccfU >> (uVar1 & 0x1f) & 1) != 0)) {
      env->banked_spsr[*(long *)(&DAT_00d74630 + (ulong)uVar1 * 8)] = (ulong)value;
      return;
    }
    break;
  case 0x11:
    env->elr_el[2] = (ulong)value;
    return;
  }
  file = 
  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
  ;
  line = 0x99;
LAB_0059e591:
  g_assertion_message_expr(file,line,(char *)0x0);
}

Assistant:

void HELPER(msr_banked)(CPUARMState *env, uint32_t value, uint32_t tgtmode,
                        uint32_t regno)
{
    msr_mrs_banked_exc_checks(env, tgtmode, regno);

    if (regno >= 8 && regno <= 12) {
        switch (tgtmode) {
            case ARM_CPU_MODE_USR:
                env->usr_regs[regno - 8] = value;
                break;
            case ARM_CPU_MODE_FIQ:
                env->fiq_regs[regno - 8] = value;
                break;
            default:
                // g_assert_not_reached();
                break;
        }
    } else {
        switch (regno) {
            case 16: /* SPSRs */
                env->banked_spsr[bank_number(tgtmode)] = value;
                break;
            case 17: /* ELR_Hyp */
                env->elr_el[2] = value;
                break;
            case 13:
                env->banked_r13[bank_number(tgtmode)] = value;
                break;
            case 14:
                env->banked_r14[r14_bank_number(tgtmode)] = value;
                break;
            default:
                g_assert_not_reached();
        }
    }
}